

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

size_t btreeblk_get_size(void *voidhandle,bid_t bid)

{
  btreeblk_handle *handle;
  
  if (bid != 0xffffffffffffffff && (char)(bid >> 0x30) != '\0') {
    voidhandle = (void *)(*(long *)((long)voidhandle + 0x60) +
                          (ulong)((uint)(bid >> 0x35) & 7) * 0x18 + -0x10);
  }
  return (ulong)*voidhandle;
}

Assistant:

size_t btreeblk_get_size(void *voidhandle, bid_t bid)
{
    bid_t _bid;
    size_t sb, idx;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (is_subblock(bid) && bid != BLK_NOT_FOUND) {
        subbid2bid(bid, &sb, &idx, &_bid);
        return handle->sb[sb].sb_size;
    } else {
        return handle->nodesize;
    }
}